

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bftst_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar1 = m68ki_read_imm_16();
    uVar2 = m68ki_read_imm_16();
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar6 = uVar1 >> 6 & 0x1f;
    }
    else {
      uVar6 = m68ki_cpu.dar[uVar1 >> 6 & 7];
    }
    if ((uVar1 & 0x20) != 0) {
      uVar1 = m68ki_cpu.dar[uVar1 & 7];
    }
    uVar2 = (int)uVar6 / 8 + (int)(short)uVar2 + -1 + (uint)((uVar6 & 0x80000007) < 0x80000001);
    uVar4 = uVar1 - 1 & 0x1f;
    uVar5 = -1 << (~(byte)uVar4 & 0x1f);
    sVar3 = (sbyte)(uVar6 & 7);
    uVar1 = m68ki_read_32_fc(uVar2,m68ki_address_space | m68ki_cpu.s_flag);
    m68ki_cpu.n_flag = ((0x80000000U >> sVar3 & uVar1) << sVar3) >> 0x18;
    m68ki_cpu.not_z_flag = uVar5 >> sVar3 & uVar1;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    if (0x20 < (uVar6 & 7) + uVar4 + 1) {
      uVar1 = m68ki_read_8_fc(uVar2 + 4,m68ki_address_space | m68ki_cpu.s_flag);
      m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar5 & uVar1 & 0xff;
    }
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bftst_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AW_8();

		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = ((data_long & (0x80000000 >> offset))<<offset)>>24;
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}